

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_level_spawn.cxx
# Opt level: O0

void __thiscall xray_re::xr_level_spawn::load(xr_level_spawn *this,xr_reader *r)

{
  cse_abstract *pcVar1;
  xr_reader *this_00;
  bool bVar2;
  size_t sVar3;
  undefined8 uVar4;
  size_t sVar5;
  cse_abstract *local_1058;
  cse_abstract *entity;
  char *name;
  undefined1 local_1040 [6];
  uint16_t pkt_id;
  xr_packet packet;
  xr_reader *pxStack_20;
  uint32_t id;
  xr_reader *s;
  xr_reader *r_local;
  xr_level_spawn *this_local;
  
  packet.m_r_pos._4_4_ = 0;
  s = r;
  r_local = (xr_reader *)this;
  while( true ) {
    pxStack_20 = xr_reader::open_chunk(s,packet.m_r_pos._4_4_);
    if (pxStack_20 == (xr_reader *)0x0) {
      return;
    }
    xr_packet::xr_packet((xr_packet *)local_1040);
    this_00 = pxStack_20;
    sVar3 = xr_reader::size(pxStack_20);
    xr_reader::r_packet(this_00,(xr_packet *)local_1040,sVar3);
    xr_packet::r_begin((xr_packet *)local_1040,(uint16_t *)((long)&name + 6));
    if (name._6_2_ != 1) break;
    entity = (cse_abstract *)xr_packet::skip_sz((xr_packet *)local_1040);
    xr_packet::r_seek((xr_packet *)local_1040,0);
    local_1058 = create_entity((char *)entity);
    if (local_1058 != (cse_abstract *)0x0) {
      cse_abstract::spawn_read(local_1058,(xr_packet *)local_1040);
      bVar2 = xr_packet::r_eof((xr_packet *)local_1040);
      if (!bVar2) {
        cse_abstract::name_replace_abi_cxx11_(local_1058);
        uVar4 = std::__cxx11::string::c_str();
        pcVar1 = entity;
        sVar3 = xr_packet::r_tell((xr_packet *)local_1040);
        sVar5 = xr_packet::w_tell((xr_packet *)local_1040);
        msg("reading %s (%s): %u <> %u",uVar4,pcVar1,sVar3,sVar5);
      }
      std::vector<xray_re::cse_abstract_*,_std::allocator<xray_re::cse_abstract_*>_>::push_back
                (&this->m_spawns,&local_1058);
    }
    xr_reader::close_chunk(s,&stack0xffffffffffffffe0);
    packet.m_r_pos._4_4_ = packet.m_r_pos._4_4_ + 1;
  }
  __assert_fail("pkt_id == M_SPAWN",
                "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_level_spawn.cxx"
                ,0x16,"void xray_re::xr_level_spawn::load(xr_reader &)");
}

Assistant:

void xr_level_spawn::load(xr_reader& r)
{
	xr_reader* s;
	for (uint32_t id = 0; (s = r.open_chunk(id)); ++id) {
		xr_packet packet;
		s->r_packet(packet, s->size());
		uint16_t pkt_id;
		packet.r_begin(pkt_id);
		xr_assert(pkt_id == M_SPAWN);
		const char* name = packet.skip_sz();
		packet.r_seek(0);
		// just skip the spawn record if we can't create it.
		if (cse_abstract* entity = create_entity(name)) {
			entity->spawn_read(packet);
			if (!packet.r_eof()) {
				msg("reading %s (%s): %u <> %u", entity->name_replace().c_str(),
						name, packet.r_tell(), packet.w_tell());
			}
			m_spawns.push_back(entity);
		}
		r.close_chunk(s);
	}
}